

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O2

int remove(char *__filename)

{
  ulong *puVar1;
  svm_example *this;
  long *plVar2;
  int iVar3;
  ostream *poVar4;
  ulong uVar5;
  size_t j;
  ulong uVar6;
  ulong in_RSI;
  ulong uVar7;
  
  puVar1 = *(ulong **)(__filename + 0x38);
  if (*puVar1 <= in_RSI) {
    poVar4 = std::operator<<((ostream *)(*(long *)(__filename + 0x88) + 0xe0),"Internal error at ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/kernel_svm.cc"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x1cd);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  this = *(svm_example **)(puVar1[1] + in_RSI * 8);
  for (uVar5 = in_RSI; uVar5 < *puVar1 - 1; uVar5 = uVar5 + 1) {
    *(undefined8 *)(puVar1[1] + uVar5 * 8) = *(undefined8 *)(puVar1[1] + 8 + uVar5 * 8);
    *(undefined4 *)(puVar1[5] + uVar5 * 4) = *(undefined4 *)(puVar1[5] + 4 + uVar5 * 4);
    *(undefined4 *)(puVar1[9] + uVar5 * 4) = *(undefined4 *)(puVar1[9] + 4 + uVar5 * 4);
  }
  svm_example::~svm_example(this);
  free(this);
  puVar1[2] = puVar1[2] - 8;
  puVar1[6] = puVar1[6] - 4;
  puVar1[10] = puVar1[10] - 4;
  uVar5 = *puVar1 - 1;
  *puVar1 = uVar5;
  iVar3 = 0;
  for (uVar6 = 0; uVar6 < uVar5; uVar6 = uVar6 + 1) {
    plVar2 = *(long **)(puVar1[1] + uVar6 * 8);
    uVar7 = plVar2[1] - *plVar2 >> 2;
    if (in_RSI < uVar7) {
      for (uVar5 = in_RSI; uVar5 < uVar7 - 1; uVar5 = uVar5 + 1) {
        *(undefined4 *)(*plVar2 + uVar5 * 4) = *(undefined4 *)(*plVar2 + 4 + uVar5 * 4);
      }
      plVar2[1] = plVar2[1] + -4;
      iVar3 = iVar3 + -1;
      uVar5 = *puVar1;
    }
  }
  return iVar3;
}

Assistant:

int remove(svm_params& params, size_t svi)
{
  svm_model* model = params.model;
  if (svi >= model->num_support)
    params.all->trace_message << "Internal error at " << __FILE__ << ":" << __LINE__ << endl;
  // shift params fields
  svm_example* svi_e = model->support_vec[svi];
  for (size_t i = svi; i < model->num_support - 1; ++i)
  {
    model->support_vec[i] = model->support_vec[i + 1];
    model->alpha[i] = model->alpha[i + 1];
    model->delta[i] = model->delta[i + 1];
  }
  svi_e->~svm_example();
  free(svi_e);
  model->support_vec.pop();
  model->alpha.pop();
  model->delta.pop();
  model->num_support--;
  // shift cache
  int alloc = 0;
  for (size_t j = 0; j < model->num_support; j++)
  {
    svm_example* e = model->support_vec[j];
    size_t rowsize = e->krow.size();
    if (svi < rowsize)
    {
      for (size_t i = svi; i < rowsize - 1; i++) e->krow[i] = e->krow[i + 1];
      e->krow.pop();
      alloc -= 1;
    }
  }
  return alloc;
}